

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

void JSON::writeDictionaryKey(Pipeline *p,bool *first,string *key,size_t depth)

{
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  writeNext(p,first,depth);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"\"",&local_79);
  std::operator+(&local_78,&local_38,key);
  std::operator+(&local_58,&local_78,"\": ");
  Pipeline::operator<<(p,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void
JSON::writeDictionaryKey(Pipeline* p, bool& first, std::string const& key, size_t depth)
{
    writeNext(p, first, depth);
    *p << std::string("\"") + key + "\": ";
}